

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

int Abc_SclComputeParametersPin(SC_Lib *p,SC_Cell *pCell,int iPin,float Slew,float *pLD,float *pPD)

{
  int iVar1;
  SC_Timing *pTime_00;
  Vec_Flt_t *p_00;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec_Flt_t *local_98;
  Vec_Flt_t *vIndex;
  SC_Timing *pTime;
  SC_Pair SlewOut;
  SC_Pair ArrOut2;
  SC_Pair ArrOut1;
  SC_Pair ArrOut0;
  SC_Pair SlewIn;
  SC_Pair ArrIn;
  SC_Pair Load2;
  SC_Pair Load1;
  SC_Pair Load0;
  float *pPD_local;
  float *pLD_local;
  float Slew_local;
  int iPin_local;
  SC_Cell *pCell_local;
  SC_Lib *p_local;
  
  memset(&SlewIn,0,8);
  ArrOut0.rise = Slew;
  ArrOut0.fall = Slew;
  memset(&ArrOut1,0,8);
  memset(&ArrOut2,0,8);
  memset(&SlewOut,0,8);
  memset(&pTime,0,8);
  pTime_00 = Scl_CellPinTime(pCell,iPin);
  if (pTime_00 == (SC_Timing *)0x0) {
    local_98 = (Vec_Flt_t *)0x0;
  }
  else {
    local_98 = &(pTime_00->pCellRise).vIndex1;
  }
  if (local_98 == (Vec_Flt_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Vec_FltSize(local_98);
    if (iVar1 == 1) {
      *pLD = 0.0;
      p_00 = (Vec_Flt_t *)Vec_PtrEntry(&(pTime_00->pCellRise).vData,0);
      fVar2 = Vec_FltEntry(p_00,0);
      *pPD = fVar2;
      p_local._4_4_ = 1;
    }
    else {
      Load1.fall = 0.0;
      Load1.rise = 0.0;
      Load2.rise = Vec_FltEntry(local_98,0);
      Load2.fall = Load2.rise;
      iVar1 = Vec_FltSize(local_98);
      ArrIn.rise = Vec_FltEntry(local_98,iVar1 + -2);
      ArrIn.fall = ArrIn.rise;
      Scl_LibPinArrival(pTime_00,&SlewIn,&ArrOut0,&Load1,&ArrOut1,(SC_Pair *)&pTime);
      Scl_LibPinArrival(pTime_00,&SlewIn,&ArrOut0,&Load2,&ArrOut2,(SC_Pair *)&pTime);
      Scl_LibPinArrival(pTime_00,&SlewIn,&ArrOut0,&ArrIn,&SlewOut,(SC_Pair *)&pTime);
      ArrOut1.rise = ArrOut1.rise * 0.5 + ArrOut1.fall * 0.5;
      ArrOut2.rise = ArrOut2.rise * 0.5 + ArrOut2.fall * 0.5;
      SlewOut.rise = SlewOut.rise * 0.5 + SlewOut.fall * 0.5;
      fVar2 = SlewOut.rise - ArrOut2.rise;
      fVar3 = ArrIn.rise - Load2.rise;
      fVar4 = SC_CellPinCap(pCell,iPin);
      *pLD = fVar2 / (fVar3 / fVar4);
      *pPD = ArrOut1.rise;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_SclComputeParametersPin( SC_Lib * p, SC_Cell * pCell, int iPin, float Slew, float * pLD, float * pPD )
{
    SC_Pair Load0, Load1, Load2;
    SC_Pair ArrIn  = { 0.0, 0.0 };
    SC_Pair SlewIn = { Slew, Slew };
    SC_Pair ArrOut0 = { 0.0, 0.0 };
    SC_Pair ArrOut1 = { 0.0, 0.0 };
    SC_Pair ArrOut2 = { 0.0, 0.0 };
    SC_Pair SlewOut = { 0.0, 0.0 };
    SC_Timing * pTime = Scl_CellPinTime( pCell, iPin );
    Vec_Flt_t * vIndex = pTime ? &pTime->pCellRise.vIndex1 : NULL; // capacitance
    if ( vIndex == NULL )
        return 0;
    // handle constant table
    if ( Vec_FltSize(vIndex) == 1 )
    {
        *pLD = 0;
        *pPD = Vec_FltEntry( (Vec_Flt_t *)Vec_PtrEntry(&pTime->pCellRise.vData, 0), 0 );
        return 1;
    }
    // get load points
    Load0.rise = Load0.fall = 0.0;
    Load1.rise = Load1.fall = Vec_FltEntry( vIndex, 0 );
    Load2.rise = Load2.fall = Vec_FltEntry( vIndex, Vec_FltSize(vIndex) - 2 );
    // compute delay
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load0, &ArrOut0, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load1, &ArrOut1, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load2, &ArrOut2, &SlewOut );
    ArrOut0.rise = 0.5 * ArrOut0.rise + 0.5 * ArrOut0.fall;
    ArrOut1.rise = 0.5 * ArrOut1.rise + 0.5 * ArrOut1.fall;
    ArrOut2.rise = 0.5 * ArrOut2.rise + 0.5 * ArrOut2.fall;
    // get tangent
    *pLD = (ArrOut2.rise - ArrOut1.rise) / ((Load2.rise - Load1.rise) / SC_CellPinCap(pCell, iPin));
    // get constant
    *pPD = ArrOut0.rise;
    return 1;
}